

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::DescriptorIndex<std::pair<const_void_*,_int>_>::AddFile
          (DescriptorIndex<std::pair<const_void_*,_int>_> *this,FileDescriptorProto *file,
          pair<const_void_*,_int> value)

{
  pair<const_void_*,_int> value_00;
  pair<const_void_*,_int> value_01;
  bool bVar1;
  byte bVar2;
  int iVar3;
  string *psVar4;
  ulong uVar5;
  undefined4 in_ECX;
  DescriptorIndex<std::pair<const_void_*,_int>_> *in_RDX;
  int i_3;
  int i_2;
  int i_1;
  int i;
  string path;
  undefined4 in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd6c;
  undefined6 in_stack_fffffffffffffd70;
  byte in_stack_fffffffffffffd76;
  undefined1 in_stack_fffffffffffffd77;
  undefined8 in_stack_fffffffffffffd78;
  LogLevel_conflict level;
  LogMessage *in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  FieldDescriptorProto *in_stack_fffffffffffffd98;
  second_type *in_stack_fffffffffffffdb0;
  DescriptorProto *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  int iVar6;
  undefined4 in_stack_fffffffffffffdc8;
  undefined2 in_stack_fffffffffffffdcc;
  undefined1 in_stack_fffffffffffffdce;
  undefined1 in_stack_fffffffffffffdcf;
  void *in_stack_fffffffffffffdd0;
  undefined8 in_stack_fffffffffffffdd8;
  string local_1a0 [36];
  int local_17c;
  DescriptorIndex<std::pair<const_void_*,_int>_> *this_00;
  void *pvVar7;
  undefined8 in_stack_fffffffffffffea8;
  string local_150 [36];
  int local_12c;
  string local_110 [36];
  int local_ec;
  undefined4 local_cc;
  string local_b8 [36];
  int local_94;
  string local_90 [32];
  string *in_stack_ffffffffffffff90;
  DescriptorIndex<std::pair<const_void_*,_int>_> *in_stack_ffffffffffffff98;
  pair<const_void_*,_int> in_stack_ffffffffffffffa0;
  undefined4 uStack_c;
  bool local_1;
  
  level = (LogLevel_conflict)((ulong)in_stack_fffffffffffffd78 >> 0x20);
  FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)0x542e03);
  bVar1 = InsertIfNotPresent<std::map<std::__cxx11::string,std::pair<void_const*,int>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<void_const*,int>>>>>
                    ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                     (first_type *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  if (bVar1) {
    bVar1 = FileDescriptorProto::has_package((FileDescriptorProto *)0x542f01);
    if (bVar1) {
      psVar4 = FileDescriptorProto::package_abi_cxx11_((FileDescriptorProto *)0x542f14);
      std::__cxx11::string::string(local_90,(string *)psVar4);
    }
    else {
      std::__cxx11::string::string(local_90);
    }
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      std::__cxx11::string::operator+=(local_90,'.');
    }
    local_94 = 0;
    while( true ) {
      iVar6 = local_94;
      iVar3 = FileDescriptorProto::message_type_size((FileDescriptorProto *)0x542f99);
      if (iVar3 <= iVar6) break;
      FileDescriptorProto::message_type
                ((FileDescriptorProto *)
                 CONCAT17(in_stack_fffffffffffffd77,
                          CONCAT16(in_stack_fffffffffffffd76,in_stack_fffffffffffffd70)),
                 in_stack_fffffffffffffd6c);
      DescriptorProto::name_abi_cxx11_((DescriptorProto *)0x542fe3);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
      bVar1 = AddSymbol(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                        in_stack_ffffffffffffffa0);
      std::__cxx11::string::~string(local_b8);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        local_1 = false;
        goto LAB_005435a0;
      }
      FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)0x5430be);
      FileDescriptorProto::message_type
                ((FileDescriptorProto *)
                 CONCAT17(in_stack_fffffffffffffd77,
                          CONCAT16(in_stack_fffffffffffffd76,in_stack_fffffffffffffd70)),
                 in_stack_fffffffffffffd6c);
      value_00._8_8_ = in_stack_fffffffffffffdd8;
      value_00.first = in_stack_fffffffffffffdd0;
      bVar1 = AddNestedExtensions((DescriptorIndex<std::pair<const_void_*,_int>_> *)
                                  CONCAT17(in_stack_fffffffffffffdcf,
                                           CONCAT16(in_stack_fffffffffffffdce,
                                                    CONCAT24(in_stack_fffffffffffffdcc,
                                                             in_stack_fffffffffffffdc8))),
                                  (string *)
                                  CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                                  in_stack_fffffffffffffdb8,value_00);
      if (!bVar1) {
        local_1 = false;
        goto LAB_005435a0;
      }
      local_94 = local_94 + 1;
    }
    local_ec = 0;
    while( true ) {
      iVar6 = local_ec;
      iVar3 = FileDescriptorProto::enum_type_size((FileDescriptorProto *)0x54318c);
      if (iVar3 <= iVar6) break;
      FileDescriptorProto::enum_type
                ((FileDescriptorProto *)
                 CONCAT17(in_stack_fffffffffffffd77,
                          CONCAT16(in_stack_fffffffffffffd76,in_stack_fffffffffffffd70)),
                 in_stack_fffffffffffffd6c);
      EnumDescriptorProto::name_abi_cxx11_((EnumDescriptorProto *)0x5431cd);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
      bVar1 = AddSymbol(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                        in_stack_ffffffffffffffa0);
      bVar2 = bVar1 ^ 0xff;
      std::__cxx11::string::~string(local_110);
      if ((bVar2 & 1) != 0) {
        local_1 = false;
        goto LAB_005435a0;
      }
      local_ec = local_ec + 1;
    }
    local_12c = 0;
    while( true ) {
      iVar6 = local_12c;
      iVar3 = FileDescriptorProto::extension_size((FileDescriptorProto *)0x5432c4);
      if (iVar3 <= iVar6) break;
      FileDescriptorProto::extension
                ((FileDescriptorProto *)
                 CONCAT17(in_stack_fffffffffffffd77,
                          CONCAT16(in_stack_fffffffffffffd76,in_stack_fffffffffffffd70)),
                 in_stack_fffffffffffffd6c);
      FieldDescriptorProto::name_abi_cxx11_((FieldDescriptorProto *)0x5432ff);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
      pvVar7 = (void *)CONCAT44(uStack_c,in_ECX);
      this_00 = in_RDX;
      bVar1 = AddSymbol(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                        in_stack_ffffffffffffffa0);
      std::__cxx11::string::~string(local_150);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        local_1 = false;
        goto LAB_005435a0;
      }
      FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)0x5433c8);
      in_stack_fffffffffffffd98 =
           FileDescriptorProto::extension
                     ((FileDescriptorProto *)
                      CONCAT17(in_stack_fffffffffffffd77,
                               CONCAT16(in_stack_fffffffffffffd76,in_stack_fffffffffffffd70)),
                      in_stack_fffffffffffffd6c);
      value_01._8_8_ = in_stack_fffffffffffffea8;
      value_01.first = pvVar7;
      bVar1 = AddExtension(this_00,(string *)CONCAT44(uStack_c,in_ECX),
                           (FieldDescriptorProto *)in_RDX,value_01);
      in_stack_fffffffffffffd94 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd94);
      if (!bVar1) {
        local_1 = false;
        goto LAB_005435a0;
      }
      local_12c = local_12c + 1;
    }
    local_17c = 0;
    while( true ) {
      iVar6 = local_17c;
      iVar3 = FileDescriptorProto::service_size((FileDescriptorProto *)0x543484);
      if (iVar3 <= iVar6) break;
      FileDescriptorProto::service
                ((FileDescriptorProto *)
                 CONCAT17(in_stack_fffffffffffffd77,
                          CONCAT16(in_stack_fffffffffffffd76,in_stack_fffffffffffffd70)),
                 in_stack_fffffffffffffd6c);
      ServiceDescriptorProto::name_abi_cxx11_((ServiceDescriptorProto *)0x5434bf);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd94,iVar3));
      in_stack_fffffffffffffd77 =
           AddSymbol(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffffa0);
      in_stack_fffffffffffffd76 = in_stack_fffffffffffffd77 ^ 0xff;
      std::__cxx11::string::~string(local_1a0);
      if ((in_stack_fffffffffffffd76 & 1) != 0) {
        local_1 = false;
        goto LAB_005435a0;
      }
      local_17c = local_17c + 1;
    }
    local_1 = true;
LAB_005435a0:
    local_cc = 1;
    std::__cxx11::string::~string(local_90);
  }
  else {
    internal::LogMessage::LogMessage
              (in_stack_fffffffffffffd80,level,
               (char *)CONCAT17(in_stack_fffffffffffffd77,
                                CONCAT16(in_stack_fffffffffffffd76,in_stack_fffffffffffffd70)),
               in_stack_fffffffffffffd6c);
    internal::LogMessage::operator<<
              ((LogMessage *)
               CONCAT17(in_stack_fffffffffffffd77,
                        CONCAT16(in_stack_fffffffffffffd76,in_stack_fffffffffffffd70)),
               (char *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)0x542e74);
    internal::LogMessage::operator<<
              ((LogMessage *)
               CONCAT17(in_stack_fffffffffffffd77,
                        CONCAT16(in_stack_fffffffffffffd76,in_stack_fffffffffffffd70)),
               (string *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    internal::LogFinisher::operator=
              ((LogFinisher *)
               CONCAT17(in_stack_fffffffffffffd77,
                        CONCAT16(in_stack_fffffffffffffd76,in_stack_fffffffffffffd70)),
               (LogMessage *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    internal::LogMessage::~LogMessage((LogMessage *)0x542ec1);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddFile(
    const FileDescriptorProto& file, Value value) {
  if (!InsertIfNotPresent(&by_name_, file.name(), value)) {
    GOOGLE_LOG(ERROR) << "File already exists in database: " << file.name();
    return false;
  }

  // We must be careful here -- calling file.package() if file.has_package() is
  // false could access an uninitialized static-storage variable if we are being
  // run at startup time.
  std::string path = file.has_package() ? file.package() : std::string();
  if (!path.empty()) path += '.';

  for (int i = 0; i < file.message_type_size(); i++) {
    if (!AddSymbol(path + file.message_type(i).name(), value)) return false;
    if (!AddNestedExtensions(file.name(), file.message_type(i), value))
      return false;
  }
  for (int i = 0; i < file.enum_type_size(); i++) {
    if (!AddSymbol(path + file.enum_type(i).name(), value)) return false;
  }
  for (int i = 0; i < file.extension_size(); i++) {
    if (!AddSymbol(path + file.extension(i).name(), value)) return false;
    if (!AddExtension(file.name(), file.extension(i), value)) return false;
  }
  for (int i = 0; i < file.service_size(); i++) {
    if (!AddSymbol(path + file.service(i).name(), value)) return false;
  }

  return true;
}